

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.hpp
# Opt level: O0

void __thiscall Lib::Deque<Kernel::TermList>::expand(Deque<Kernel::TermList> *this)

{
  long lVar1;
  size_t sVar2;
  void *pvVar3;
  Deque<Kernel::TermList> *in_RDI;
  size_t i;
  TermList *oldPtr;
  TermList *newData;
  void *mem;
  size_t newCapacity;
  size_t curSize;
  ulong local_38;
  undefined8 *local_30;
  
  sVar2 = size(in_RDI);
  lVar1 = *(long *)in_RDI;
  pvVar3 = Lib::alloc((size_t)in_RDI);
  local_30 = *(undefined8 **)(in_RDI + 0x10);
  for (local_38 = 0; local_38 < sVar2; local_38 = local_38 + 1) {
    *(undefined8 *)((long)pvVar3 + local_38 * 8) = *local_30;
    local_30 = local_30 + 1;
    if (local_30 == *(undefined8 **)(in_RDI + 0x20)) {
      local_30 = *(undefined8 **)(in_RDI + 8);
    }
  }
  Lib::free(*(void **)(in_RDI + 8));
  *(void **)(in_RDI + 8) = pvVar3;
  *(long *)(in_RDI + 0x10) = *(long *)(in_RDI + 8);
  *(size_t *)(in_RDI + 0x18) = *(long *)(in_RDI + 8) + sVar2 * 8;
  *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 8) + lVar1 * 0x10;
  *(long *)in_RDI = lVar1 * 2;
  return;
}

Assistant:

void expand ()
  {
    ASS(shouldExpand());

    size_t curSize=size();
    size_t newCapacity = 2 * _capacity;

    // allocate new stack and copy old stack's content to the new place
    void* mem = ALLOC_KNOWN(newCapacity*sizeof(C),"Deque<>");

    C* newData = static_cast<C*>(mem);
    C* oldPtr=_front;
    for(size_t i = 0; i<curSize; i++) {
      ::new (newData+i) C(*oldPtr);
      oldPtr->~C();

      oldPtr++;
      if(oldPtr==_end) {
	oldPtr=_data;
      }
    }
    ASS_EQ(oldPtr, _back);
    // deallocate the old stack
    DEALLOC_KNOWN(_data,_capacity*sizeof(C),"Deque<>");

    _data = newData;
    _front = _data;
    _back = _data + curSize;
    _end = _data + newCapacity;
    _capacity = newCapacity;
  }